

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature,cmListFileContext *lfc)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer ppVar2;
  bool bVar3;
  bool bVar4;
  TLLSignature local_1c;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  ppVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->TLLCommands + 8);
  local_1c = signature;
  if (*(pointer *)
       &((_Var1._M_head_impl)->TLLCommands).
        super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      == ppVar2) {
    bVar4 = true;
  }
  else {
    bVar4 = ppVar2[0xffffffffffffffff].first == signature;
    bVar3 = operator!=((cmListFileContext *)((long)(ppVar2 + 0xffffffffffffffff) + 8),lfc);
    if (!bVar3) {
      return bVar4;
    }
  }
  std::
  vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
  ::emplace_back<cmTarget::TLLSignature&,cmListFileContext_const&>
            ((vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
              *)&((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TLLCommands,
             &local_1c,lfc);
  return bVar4;
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature,
                                   cmListFileContext const& lfc)
{
  bool ret = true;
  if (!this->impl->TLLCommands.empty()) {
    if (this->impl->TLLCommands.back().first != signature) {
      ret = false;
    }
  }
  if (this->impl->TLLCommands.empty() ||
      this->impl->TLLCommands.back().second != lfc) {
    this->impl->TLLCommands.emplace_back(signature, lfc);
  }
  return ret;
}